

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

void __thiscall minihttp::HttpSocket::_ParseHeaderFields(HttpSocket *this,char *s,size_t size)

{
  undefined8 uVar1;
  int iVar2;
  char *__s;
  ulong uVar3;
  mapped_type *this_00;
  bool bVar4;
  allocator local_99;
  string local_98 [8];
  string valstr;
  allocator local_61;
  undefined1 local_60 [8];
  string key;
  char *val;
  char *valEnd;
  char *colon;
  char *maxs;
  size_t size_local;
  char *s_local;
  HttpSocket *this_local;
  
  size_local = (size_t)s;
  while( true ) {
    if (s + size <= size_local) {
      return;
    }
    while (iVar2 = isspace((int)*(char *)size_local), iVar2 != 0) {
      size_local = size_local + 1;
      if (s + size <= size_local) {
        return;
      }
    }
    __s = strchr((char *)size_local,0x3a);
    if (__s == (char *)0x0) break;
    val = strchr(__s,10);
    if (val == (char *)0x0) {
      return;
    }
    while( true ) {
      bVar4 = true;
      if (val[-1] != '\n') {
        bVar4 = val[-1] == '\r';
      }
      key.field_2._8_8_ = __s;
      if (!bVar4) break;
      val = val + -1;
    }
    do {
      key.field_2._8_8_ = key.field_2._8_8_ + 1;
      iVar2 = isspace((int)*(char *)key.field_2._8_8_);
    } while (iVar2 != 0 && (ulong)key.field_2._8_8_ < val);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_60,(char *)size_local,(long)__s - size_local,&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    strToLower((string *)local_60);
    uVar1 = key.field_2._8_8_;
    uVar3 = (long)val - key.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,(char *)uVar1,uVar3,&local_99);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->_hdrs,(key_type *)local_60);
    std::__cxx11::string::operator=((string *)this_00,local_98);
    size_local = (size_t)val;
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

void HttpSocket::_ParseHeaderFields(const char *s, size_t size)
{
    // Key: Value data\r\n

    const char * const maxs = s + size;
    while(s < maxs)
    {
        while(isspace(*s))
        {
            ++s;
            if(s >= maxs)
                return;
        }
        const char * const colon = strchr(s, ':');
        if(!colon)
            return;
        const char *valEnd = strchr(colon, '\n'); // last char of val data
        if(!valEnd)
            return;
        while(valEnd[-1] == '\n' || valEnd[-1] == '\r') // skip backwards if necessary
            --valEnd;
        const char *val = colon + 1; // value starts after ':' ...
        while(isspace(*val) && val < valEnd) // skip spaces after the colon
            ++val;
        std::string key(s, colon - s);
        strToLower(key);
        std::string valstr(val, valEnd - val);
        _hdrs[key] = valstr;
        traceprint("HDR: %s: %s\n", key.c_str(), valstr.c_str());
        s = valEnd;
    }
}